

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_dotprod(Context *ctx,char *src0,char *src1,char *extra)

{
  uint uVar1;
  char local_d8 [8];
  char code [128];
  char *local_50;
  char *castright;
  char castleft [16];
  int vecsize;
  char *extra_local;
  char *src1_local;
  char *src0_local;
  Context *ctx_local;
  
  uVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  memset(&castright,0,0x10);
  local_50 = "";
  if (uVar1 != 1) {
    snprintf((char *)&castright,0x10,"vec%d(",(ulong)uVar1);
    local_50 = ")";
  }
  make_GLSL_destarg_assign
            (ctx,local_d8,0x80,"%sdot(%s, %s)%s%s",&castright,src0,src1,extra,local_50);
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_GLSL_dotprod(Context *ctx, const char *src0, const char *src1,
                              const char *extra)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char castleft[16] = { '\0' };
    const char *castright = "";
    if (vecsize != 1)
    {
        snprintf(castleft, sizeof (castleft), "vec%d(", vecsize);
        castright = ")";
    } // if

    char code[128];
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "%sdot(%s, %s)%s%s",
                             castleft, src0, src1, extra, castright);
    output_line(ctx, "%s", code);
}